

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1Truncate(sqlite3_pcache *p,uint iLimit)

{
  uint in_ESI;
  long in_RDI;
  PCache1 *pCache;
  
  if (in_ESI <= *(uint *)(in_RDI + 0x2c)) {
    pcache1TruncateUnsafe(pCache,(uint)((ulong)in_RDI >> 0x20));
    *(uint *)(in_RDI + 0x2c) = in_ESI - 1;
  }
  return;
}

Assistant:

static void pcache1Truncate(sqlite3_pcache *p, unsigned int iLimit){
  PCache1 *pCache = (PCache1 *)p;
  pcache1EnterMutex(pCache->pGroup);
  if( iLimit<=pCache->iMaxKey ){
    pcache1TruncateUnsafe(pCache, iLimit);
    pCache->iMaxKey = iLimit-1;
  }
  pcache1LeaveMutex(pCache->pGroup);
}